

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_neighbor_alltoall_
               (void *sendbuf,MPIABI_Fint *sendcount,MPIABI_Fint *senddtype,void *recvbuf,
               MPIABI_Fint *recvcount,MPIABI_Fint *recvtype,MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  mpi_neighbor_alltoall_();
  return;
}

Assistant:

void mpiabi_neighbor_alltoall_(
  const void * sendbuf,
  const MPIABI_Fint * sendcount,
  const MPIABI_Fint * senddtype,
  void * recvbuf,
  const MPIABI_Fint * recvcount,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_neighbor_alltoall_(
    sendbuf,
    sendcount,
    senddtype,
    recvbuf,
    recvcount,
    recvtype,
    comm,
    ierror
  );
}